

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_2d_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  CONV_BUF_TYPE *pCVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint16_t *puVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  short *psVar14;
  short *psVar15;
  ulong uVar16;
  int iVar17;
  uint16_t uVar18;
  long lVar19;
  int iVar20;
  bool bVar21;
  int local_8ba8;
  ulong local_8ba0;
  ulong local_8b98;
  short *local_8b88;
  uint local_8b68;
  short asStack_8b38 [17796];
  
  uVar1 = filter_params_y->taps;
  uVar11 = (h + (uint)uVar1) - 1;
  iVar8 = (uVar1 >> 1) - 1;
  lVar19 = (long)w;
  bVar7 = (byte)conv_params->round_0;
  if (0 < (int)uVar11) {
    uVar2 = filter_params_x->taps;
    piVar3 = filter_params_x->filter_ptr;
    iVar20 = 1 << ((char)bd + 6U & 0x1f);
    local_8ba8 = 1 - (uint)(uVar2 >> 1);
    local_8b98 = 0;
    do {
      if (0 < w) {
        uVar13 = 0;
        iVar12 = local_8ba8;
        do {
          iVar17 = iVar20;
          if (uVar2 != 0) {
            uVar16 = 0;
            do {
              iVar17 = iVar17 + (uint)src[((long)iVar12 + uVar16) - (long)(iVar8 * src_stride)] *
                                (int)*(short *)((long)piVar3 +
                                               uVar16 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
              uVar16 = uVar16 + 1;
            } while ((uint)uVar2 != uVar16);
          }
          asStack_8b38[uVar13 + local_8b98 * lVar19] =
               (short)(iVar17 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f));
          uVar13 = uVar13 + 1;
          iVar12 = iVar12 + 1;
        } while (uVar13 != (uint)w);
      }
      local_8b98 = local_8b98 + 1;
      local_8ba8 = local_8ba8 + src_stride;
    } while (local_8b98 != uVar11);
  }
  local_8b68 = (uint)uVar1;
  if (0 < h) {
    bVar5 = (byte)conv_params->round_1;
    bVar6 = ('\x0e' - bVar7) - bVar5;
    pCVar4 = conv_params->dst;
    iVar20 = conv_params->dst_stride;
    piVar3 = filter_params_y->filter_ptr;
    bVar7 = ((char)bd - bVar7) + 0xe;
    iVar12 = 1 << (bVar7 & 0x1f);
    bVar7 = bVar7 - bVar5;
    local_8b88 = asStack_8b38 + (1 - (ulong)(uint)(uVar1 >> 1)) * lVar19 + (long)(iVar8 * w);
    local_8ba0 = 0;
    do {
      if (0 < w) {
        iVar8 = conv_params->do_average;
        uVar13 = 0;
        psVar15 = local_8b88;
        do {
          iVar17 = iVar12;
          if ((ulong)filter_params_y->taps != 0) {
            uVar16 = 0;
            psVar14 = psVar15;
            do {
              iVar17 = iVar17 + (int)*psVar14 *
                                (int)*(short *)((long)piVar3 +
                                               uVar16 * 2 +
                                               (ulong)((subpel_y_qn & 0xfU) * local_8b68 * 2));
              uVar16 = uVar16 + 1;
              psVar14 = psVar14 + lVar19;
            } while (filter_params_y->taps != uVar16);
          }
          uVar11 = iVar17 + ((1 << (bVar5 & 0x1f)) >> 1) >> (bVar5 & 0x1f);
          puVar10 = pCVar4 + local_8ba0 * (long)iVar20;
          uVar18 = (uint16_t)uVar11;
          if (iVar8 != 0) {
            uVar9 = (uint)(pCVar4 + local_8ba0 * (long)iVar20)[uVar13];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              uVar11 = (uVar11 & 0xffff) + uVar9 >> 1;
            }
            else {
              uVar11 = (int)((uVar11 & 0xffff) * conv_params->bck_offset +
                            uVar9 * conv_params->fwd_offset) >> 4;
            }
            uVar11 = (int)(uVar11 + ((1 << (bVar6 & 0x1f)) >> 1) + (-1 << (bVar7 & 0x1f)) +
                                    (-1 << (bVar7 - 1 & 0x1f))) >> (bVar6 & 0x1f);
            if (bd == 10) {
              bVar21 = uVar11 < 0x3ff;
              uVar9 = 0x3ff;
            }
            else if (bd == 0xc) {
              bVar21 = uVar11 < 0xfff;
              uVar9 = 0xfff;
            }
            else {
              bVar21 = uVar11 < 0xff;
              uVar9 = 0xff;
            }
            if (bVar21) {
              uVar9 = uVar11;
            }
            puVar10 = dst + local_8ba0 * (long)dst_stride;
            uVar18 = (uint16_t)uVar9;
            if ((int)uVar11 < 0) {
              uVar18 = 0;
            }
          }
          puVar10[uVar13] = uVar18;
          uVar13 = uVar13 + 1;
          psVar15 = psVar15 + 1;
        } while (uVar13 != (uint)w);
      }
      local_8ba0 = local_8ba0 + 1;
      local_8b88 = local_8b88 + lVar19;
    } while (local_8ba0 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  int x, y, k;
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);

  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (y = 0; y < im_h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      (void)bd;
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= (1 << (offset_bits - conv_params->round_1)) +
               (1 << (offset_bits - conv_params->round_1 - 1));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}